

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

boolean seed_tree(level *lev,xchar x,xchar y)

{
  level *plVar1;
  boolean bVar2;
  char cVar3;
  int dd;
  int iVar4;
  trap *ptVar5;
  long lVar6;
  long lVar7;
  int local_38;
  int local_34;
  int dy;
  int dx;
  int nogrow;
  int dir;
  rm *loc;
  coord pos2;
  coord pos;
  xchar y_local;
  level *plStack_18;
  xchar x_local;
  level *lev_local;
  
  loc._6_1_ = y;
  loc._7_1_ = x;
  plStack_18 = lev;
  rndmappos((xchar *)((long)&loc + 7),(xchar *)((long)&loc + 6));
  if (((plStack_18->locations[loc._7_1_][loc._6_1_].typ == '\r') ||
      (((*(uint *)&(plStack_18->flags).field_0x8 >> 0x14 & 1) != 0 &&
       (plStack_18->locations[loc._7_1_][loc._6_1_].typ == '\0')))) &&
     (bVar2 = may_dig(plStack_18,loc._7_1_,loc._6_1_), bVar2 != '\0')) {
    dd = rn2(8);
    dtoxy((coord *)((long)&loc + 4),dd);
    loc._4_1_ = loc._4_1_ + loc._7_1_;
    loc._5_1_ = loc._5_1_ + loc._6_1_;
    iVar4 = rn2(3);
    if (iVar4 == 0) {
      iVar4 = rn2(2);
      dtoxy((coord *)((long)&loc + 2),(dd + iVar4) % 8);
      loc._4_1_ = loc._4_1_ + loc._2_1_;
      loc._5_1_ = loc._5_1_ + loc._3_1_;
    }
    plVar1 = plStack_18;
    if ((((loc._4_1_ < '\x01') || ('O' < loc._4_1_)) || (loc._5_1_ < '\0')) || ('\x14' < loc._5_1_))
    {
      return '\0';
    }
    lVar6 = (long)loc._4_1_;
    lVar7 = (long)loc._5_1_;
    if (((((*(uint *)&plStack_18->locations[lVar6][lVar7].field_0x6 >> 10 & 1) != 0) &&
         ((viz_array[loc._5_1_][loc._4_1_] & 2U) == 0)) &&
        ((cVar3 = inside_shop(plStack_18,loc._4_1_,loc._5_1_), cVar3 == '\0' &&
         ((plVar1->locations[lVar6][lVar7].typ == '\x19' ||
          (plVar1->locations[lVar6][lVar7].typ == '\x18')))))) &&
       (((u.ux != loc._4_1_ || (u.uy != loc._5_1_)) &&
        ((((plStack_18->monsters[loc._4_1_][loc._5_1_] == (monst *)0x0 ||
           ((*(uint *)&plStack_18->monsters[loc._4_1_][loc._5_1_]->field_0x60 >> 9 & 1) != 0)) ||
          (plStack_18->monsters[loc._4_1_][loc._5_1_] == (monst *)0x0)) &&
         ((ptVar5 = t_at(plStack_18,(int)loc._4_1_,(int)loc._5_1_), ptVar5 == (trap *)0x0 &&
          (level->objects[loc._4_1_][loc._5_1_] == (obj *)0x0)))))))) {
      dy = 0;
      for (local_34 = loc._4_1_ + -1; local_34 <= loc._4_1_ + 1; local_34 = local_34 + 1) {
        for (local_38 = loc._5_1_ + -1; local_38 <= loc._5_1_ + 1; local_38 = local_38 + 1) {
          if ((((local_34 < 1) || (0x4f < local_34)) || ((local_38 < 0 || (0x14 < local_38)))) ||
             ((((0 < local_34 && (local_34 < 0x50)) && (-1 < local_38)) &&
              ((local_38 < 0x15 && (plStack_18->locations[local_34][local_38].typ < '\x18')))))) {
            dy = dy + 1;
          }
        }
      }
      if (dy < 3) {
        plVar1->locations[lVar6][lVar7].typ = '\r';
        *(uint *)&plVar1->locations[lVar6][lVar7].field_0x6 =
             *(uint *)&plVar1->locations[lVar6][lVar7].field_0x6 & 0xfffffe0f |
             (*(uint *)&plVar1->locations[lVar6][lVar7].field_0x6 >> 4 & 0x1e) << 4;
        block_point((int)loc._4_1_,(int)loc._5_1_);
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

static boolean seed_tree(struct level *lev, xchar x, xchar y)
{
	coord pos, pos2;
	struct rm *loc;

	rndmappos(&x, &y);
	if (IS_TREE(lev, lev->locations[x][y].typ) && may_dig(lev, x, y)) {
	    int dir = rn2(8);
	    dtoxy(&pos, dir);
	    pos.x += x;
	    pos.y += y;
	    if (!rn2(3)) {
		dtoxy(&pos2, (dir + rn2(2)) % 8);
		pos.x += pos2.x;
		pos.y += pos2.y;
	    }
	    if (!isok(pos.x,pos.y))
		return FALSE;
	    loc = &lev->locations[pos.x][pos.y];
	    if (loc->lit && !cansee(pos.x, pos.y) &&
		    !inside_shop(lev, pos.x, pos.y) &&
		    (loc->typ == ROOM || loc->typ == CORR) &&
		    !(u.ux == pos.x && u.uy == pos.y) &&
		    !m_at(lev, pos.x, pos.y) &&
		    !t_at(lev, pos.x, pos.y) &&
		    !OBJ_AT(pos.x,pos.y)) {
		int nogrow = 0;
		int dx, dy;
		for (dx = pos.x - 1; dx <= pos.x + 1; dx++) {
		    for (dy = pos.y - 1; dy <= pos.y + 1; dy++) {
			if (!isok(dx, dy) ||
			    (isok(dx, dy) &&
			     !SPACE_POS(lev->locations[dx][dy].typ)))
			    nogrow++;
		    }
		}
		if (nogrow < 3) {
		    loc->typ = TREE;
		    loc->looted &= ~TREE_LOOTED;
		    block_point(pos.x, pos.y);
		    return TRUE;
		}
	    }
	}
	return FALSE;
}